

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O3

Aig_Man_t * Iso_ManFilterPos(Aig_Man_t *pAig,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  int *piVar1;
  Vec_Str_t *pVVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  Aig_Man_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  size_t sVar16;
  long lVar17;
  int i;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  long lVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  timespec ts;
  uint local_ac;
  int *local_a8;
  timespec local_a0;
  double local_90;
  Aig_Man_t *local_88;
  int local_7c;
  ulong local_78;
  double local_70;
  Aig_Man_t *local_68;
  ulong local_60;
  long local_58;
  long local_50;
  Vec_Ptr_t **local_48;
  Vec_Str_t *local_40;
  Aig_Man_t *local_38;
  
  local_7c = fVerbose;
  clock_gettime(3,&local_a0);
  *pvPosEquivs = (Vec_Ptr_t *)0x0;
  uVar14 = pAig->nObjs[3] - pAig->nRegs;
  iVar3 = 0x10;
  local_68 = pAig;
  local_48 = pvPosEquivs;
  local_a8 = (int *)malloc(0x10);
  local_78 = 8;
  if (6 < uVar14 - 1) {
    local_78 = (ulong)uVar14;
  }
  local_a8[1] = 0;
  iVar4 = (int)local_78;
  *local_a8 = iVar4;
  dVar21 = 0.0;
  local_60 = (ulong)uVar14;
  if (iVar4 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    sVar16 = (long)iVar4 << 3;
    pvVar5 = malloc(sVar16);
    iVar3 = (int)sVar16;
  }
  *(void **)(local_a8 + 2) = pvVar5;
  local_ac = 0;
  if ((int)local_60 < 1) {
    dVar25 = 0.0;
    dVar24 = 0.0;
    pAVar6 = (Aig_Man_t *)0x0;
  }
  else {
    dVar21 = 0.0;
    lVar19 = 0;
    lVar15 = 0;
    lVar17 = 0;
    do {
      local_90 = dVar21;
      if ((local_ac * -0x3d70a3d7 + 0x51eb850 >> 2 | local_ac * 0x40000000) < 0x28f5c29) {
        printf("%6d finished...\r");
      }
      iVar3 = clock_gettime(3,&local_a0);
      if (iVar3 < 0) {
        local_70 = 4.94065645841247e-324;
      }
      else {
        lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
        local_70 = (double)(((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_a0.tv_sec * -1000000);
      }
      pAVar6 = Saig_ManDupCones(local_68,(int *)&local_ac,1);
      iVar3 = clock_gettime(3,&local_a0);
      if (iVar3 < 0) {
        local_50 = -1;
      }
      else {
        local_50 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
      }
      iVar3 = clock_gettime(3,&local_a0);
      if (iVar3 < 0) {
        local_58 = 1;
      }
      else {
        lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
        local_58 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_a0.tv_sec * -1000000;
      }
      local_88 = Saig_ManDupIsoCanonical(pAVar6,0);
      iVar3 = clock_gettime(3,&local_a0);
      if (iVar3 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
      }
      local_38 = pAVar6;
      iVar3 = clock_gettime(3,&local_a0);
      if (iVar3 < 0) {
        lVar13 = 1;
      }
      else {
        lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
        lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_a0.tv_sec * -1000000;
      }
      local_40 = Ioa_WriteAigerIntoMemoryStr(local_88);
      iVar3 = clock_gettime(3,&local_a0);
      if (iVar3 < 0) {
        lVar22 = -1;
      }
      else {
        lVar22 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
      }
      iVar3 = (int)local_78;
      if (local_90._0_4_ == iVar3) {
        if (iVar3 < 0x10) {
          if (*(void **)(local_a8 + 2) == (void *)0x0) {
            pvVar5 = malloc(0x80);
          }
          else {
            pvVar5 = realloc(*(void **)(local_a8 + 2),0x80);
          }
          *(void **)(local_a8 + 2) = pvVar5;
          *local_a8 = 0x10;
          local_78 = 0x10;
        }
        else {
          local_78 = (ulong)(uint)(iVar3 * 2);
          if (*(void **)(local_a8 + 2) == (void *)0x0) {
            pvVar5 = malloc(local_78 * 8);
          }
          else {
            pvVar5 = realloc(*(void **)(local_a8 + 2),local_78 * 8);
          }
          *(void **)(local_a8 + 2) = pvVar5;
          *local_a8 = (int)local_78;
        }
      }
      else {
        pvVar5 = *(void **)(local_a8 + 2);
      }
      pVVar2 = local_40;
      lVar17 = lVar17 + (long)local_70 + local_50;
      lVar19 = lVar19 + local_58 + lVar12;
      lVar15 = lVar15 + lVar13 + lVar22;
      dVar21 = (double)((long)local_90 + 1);
      local_a8[1] = SUB84(dVar21,0);
      *(Vec_Str_t **)((long)pvVar5 + (long)local_90 * 8) = local_40;
      Aig_ManStop(local_88);
      pAVar6 = local_38;
      Aig_ManStop(local_38);
      iVar3 = (int)pAVar6;
      pVVar2->nCap = local_ac;
      local_ac = local_ac + 1;
    } while ((int)local_ac < (int)local_60);
    dVar25 = (double)lVar17;
    pAVar6 = (Aig_Man_t *)(double)lVar19;
    dVar24 = (double)lVar15;
  }
  if (local_7c != 0) {
    local_90 = dVar24;
    local_88 = pAVar6;
    local_70 = dVar25;
    Abc_Print(iVar3,"%s =","Duplicate time");
    Abc_Print(iVar3,"%9.2f sec\n",local_70 / 1000000.0);
    Abc_Print(iVar3,"%s =","Isomorph  time");
    Abc_Print(iVar3,"%9.2f sec\n",(double)local_88 / 1000000.0);
    Abc_Print(iVar3,"%s =","AIGER     time");
    Abc_Print(iVar3,"%9.2f sec\n",local_90 / 1000000.0);
  }
  clock_gettime(3,&local_a0);
  iVar3 = SUB84(dVar21,0);
  if (1 < iVar3) {
    qsort(*(void **)(local_a8 + 2),(ulong)dVar21 & 0xffffffff,8,Iso_StoCompareVecStr);
  }
  iVar4 = clock_gettime(3,&local_a0);
  if (iVar4 < 0) {
    local_88 = (Aig_Man_t *)0x1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
    local_88 = (Aig_Man_t *)(((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_a0.tv_sec * -1000000);
  }
  uVar14 = local_68->nTruePos;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar20 = 8;
  if (6 < uVar14 - 1) {
    uVar20 = (ulong)uVar14;
  }
  iVar4 = (int)uVar20;
  pVVar7->nCap = iVar4;
  if (iVar4 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar4 << 3);
  }
  pVVar7->pArray = ppvVar8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x10;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  pVVar9->pArray = piVar10;
  if (iVar4 == 0) {
    if (ppvVar8 == (void **)0x0) {
      ppvVar8 = (void **)malloc(0x80);
    }
    else {
      ppvVar8 = (void **)realloc(ppvVar8,0x80);
    }
    pVVar7->pArray = ppvVar8;
    pVVar7->nCap = 0x10;
    uVar20 = 0x10;
  }
  pVVar7->nSize = 1;
  *ppvVar8 = pVVar9;
  local_90 = (double)uVar20;
  if (0 < iVar3) {
    puVar11 = *(undefined8 **)(local_a8 + 2);
    piVar10 = (int *)*puVar11;
    Vec_IntPush(pVVar9,*piVar10);
    local_ac = 1;
    uVar14 = 1;
    if (iVar3 != 1) {
      uVar14 = 1;
      do {
        if ((int)local_ac < 0) goto LAB_0062d506;
        piVar1 = *(int **)(*(long *)(local_a8 + 2) + (ulong)local_ac * 8);
        if (piVar1 == (int *)0x0) {
LAB_0062d245:
          puVar11 = (undefined8 *)malloc(0x10);
          *puVar11 = 0x10;
          pvVar5 = malloc(0x40);
          puVar11[1] = pvVar5;
          uVar18 = SUB84(local_90,0);
          if (uVar14 == uVar18) {
            if ((int)uVar18 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = 0x10;
              local_90 = 7.90505033345994e-323;
            }
            else {
              uVar18 = uVar18 * 2;
              sVar16 = (ulong)uVar18 * 8;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(sVar16);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,sVar16);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = uVar18;
              local_90 = (double)(ulong)uVar18;
            }
          }
          else {
            ppvVar8 = pVVar7->pArray;
          }
          pVVar7->nSize = uVar14 + 1;
          ppvVar8[(int)uVar14] = puVar11;
          bVar23 = (int)uVar14 < 0;
          uVar14 = uVar14 + 1;
          if (bVar23) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
          }
        }
        else {
          iVar4 = piVar10[1];
          if (iVar4 == piVar1[1]) {
            iVar4 = memcmp(*(void **)(piVar10 + 2),*(void **)(piVar1 + 2),(long)iVar4);
          }
          else {
            iVar4 = iVar4 - piVar1[1];
          }
          if (iVar4 != 0) goto LAB_0062d245;
        }
        Vec_IntPush((Vec_Int_t *)pVVar7->pArray[(ulong)uVar14 - 1],*piVar1);
        local_ac = local_ac + 1;
        piVar10 = piVar1;
      } while ((int)local_ac < iVar3);
      puVar11 = *(undefined8 **)(local_a8 + 2);
    }
    lVar15 = 0;
    piVar10 = local_a8;
    do {
      pvVar5 = (void *)puVar11[lVar15];
      if (pvVar5 != (void *)0x0) {
        if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar5 + 8));
        }
        free(pvVar5);
        dVar21 = (double)(ulong)(uint)local_a8[1];
        piVar10 = local_a8;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < SUB84(dVar21,0));
    free(puVar11);
    free(piVar10);
    if (local_7c != 0) {
      iVar4 = 3;
      iVar3 = clock_gettime(3,&local_a0);
      if (iVar3 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
      }
      lVar15 = lVar15 + (long)local_88;
      Abc_Print(iVar4,"%s =","Sorting   time");
      Abc_Print(iVar4,"%9.2f sec\n",(double)lVar15 / 1000000.0);
    }
    local_ac = 0;
    do {
      if ((int)local_ac < 0) goto LAB_0062d506;
      ppvVar8 = pVVar7->pArray;
      qsort(*(void **)((long)ppvVar8[local_ac] + 8),(long)*(int *)((long)ppvVar8[local_ac] + 4),4,
            Vec_IntSortCompare1);
      local_ac = local_ac + 1;
    } while ((int)local_ac < (int)uVar14);
    qsort(ppvVar8,(ulong)uVar14,8,Vec_VecSortCompare3);
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 100;
    pVVar9->nSize = 0;
    piVar10 = (int *)malloc(400);
    pVVar9->pArray = piVar10;
    local_ac = 0;
    while (-1 < (int)local_ac) {
      if (*(int *)((long)ppvVar8[local_ac] + 4) < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(pVVar9,**(int **)((long)ppvVar8[local_ac] + 8));
      local_ac = local_ac + 1;
      if ((int)uVar14 <= (int)local_ac) {
        piVar10 = pVVar9->pArray;
        pAVar6 = Saig_ManDupCones(local_68,piVar10,pVVar9->nSize);
        if (piVar10 != (int *)0x0) {
          free(piVar10);
        }
        free(pVVar9);
        *local_48 = pVVar7;
        return pAVar6;
      }
    }
  }
LAB_0062d506:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Iso_ManFilterPos( Aig_Man_t * pAig, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
//    int fVeryVerbose = 0;
    Aig_Man_t * pPart, * pTemp;
    Vec_Ptr_t * vBuffers, * vClasses;
    Vec_Int_t * vLevel, * vRemain;
    Vec_Str_t * vStr, * vPrev;
    int i, nPos;
    abctime clk = Abc_Clock();
    abctime clkDup = 0, clkAig = 0, clkIso = 0, clk2;
    *pvPosEquivs = NULL;

    // derive AIG for each PO
    nPos = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
    vBuffers = Vec_PtrAlloc( nPos );
    for ( i = 0; i < nPos; i++ )
    {
        if ( i % 100 == 0 )
            printf( "%6d finished...\r", i );

        clk2 = Abc_Clock();
        pPart = Saig_ManDupCones( pAig, &i, 1 );
        clkDup += Abc_Clock() - clk2;

        clk2 = Abc_Clock();
        pTemp = Saig_ManDupIsoCanonical( pPart, 0 );
        clkIso += Abc_Clock() - clk2;

        clk2 = Abc_Clock();
        vStr  = Ioa_WriteAigerIntoMemoryStr( pTemp );
        clkAig += Abc_Clock() - clk2;

        Vec_PtrPush( vBuffers, vStr );
        Aig_ManStop( pTemp );
        Aig_ManStop( pPart );
        // remember the output number in nCap (attention: hack!)
        vStr->nCap = i;
    }
//    s_Counter = 0;
    if ( fVerbose )
    {
    Abc_PrintTime( 1, "Duplicate time", clkDup );
    Abc_PrintTime( 1, "Isomorph  time", clkIso );
    Abc_PrintTime( 1, "AIGER     time", clkAig );
    }

    // sort the infos
    clk = Abc_Clock();
    Vec_PtrSort( vBuffers, (int (*)(void))Iso_StoCompareVecStr );

    // create classes
    clk = Abc_Clock();
    vClasses = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    // start the first class
    Vec_PtrPush( vClasses, (vLevel = Vec_IntAlloc(4)) );
    vPrev = (Vec_Str_t *)Vec_PtrEntry( vBuffers, 0 );
    Vec_IntPush( vLevel, vPrev->nCap );
    // consider other classes
    Vec_PtrForEachEntryStart( Vec_Str_t *, vBuffers, vStr, i, 1 )
    {
        if ( Vec_StrCompareVec(vPrev, vStr) )
            Vec_PtrPush( vClasses, Vec_IntAlloc(4) );
        vLevel = (Vec_Int_t *)Vec_PtrEntryLast( vClasses );
        Vec_IntPush( vLevel, vStr->nCap );
        vPrev = vStr;
    }
    Vec_VecFree( (Vec_Vec_t *)vBuffers );

    if ( fVerbose )
    Abc_PrintTime( 1, "Sorting   time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Traversal time", time_Trav );

    // report the results
//    Vec_VecPrintInt( (Vec_Vec_t *)vClasses );
//    printf( "Devided %d outputs into %d cand equiv classes.\n", Saig_ManPoNum(pAig), Vec_PtrSize(vClasses) );
/*
    if ( fVerbose )
    {
        Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
            if ( Vec_IntSize(vLevel) > 1 )
                printf( "%d ", Vec_IntSize(vLevel) );
            else
                nUnique++;
        printf( " Unique = %d\n", nUnique );
    }
*/

    // canonicize order
    Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
        Vec_IntSort( vLevel, 0 );
     Vec_VecSortByFirstInt( (Vec_Vec_t *)vClasses, 0 );
       
    // collect the first ones
    vRemain = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
        Vec_IntPush( vRemain, Vec_IntEntry(vLevel, 0) );

    // derive the resulting AIG
    pPart = Saig_ManDupCones( pAig, Vec_IntArray(vRemain), Vec_IntSize(vRemain) );
    Vec_IntFree( vRemain );

//    return (Vec_Vec_t *)vClasses;
//    Vec_VecFree( (Vec_Vec_t *)vClasses );
    *pvPosEquivs = vClasses;
    return pPart;
}